

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SettingsHandlerWindow_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  float y;
  float x;
  int i;
  float local_1c;
  float local_18;
  int local_14;
  
  iVar3 = __isoc99_sscanf(line,"Pos=%f,%f",&local_18,&local_1c);
  if (iVar3 == 2) {
    *(float *)((long)entry + 0xc) = local_18;
    *(float *)((long)entry + 0x10) = local_1c;
  }
  else {
    iVar3 = __isoc99_sscanf(line,"Size=%f,%f",&local_18,&local_1c);
    if (iVar3 == 2) {
      fVar1 = (GImGui->Style).WindowMinSize.x;
      fVar2 = (GImGui->Style).WindowMinSize.y;
      uVar4 = -(uint)(fVar1 <= local_18);
      uVar5 = -(uint)(fVar2 <= local_1c);
      *(ulong *)((long)entry + 0x14) =
           CONCAT44(~uVar5 & (uint)fVar2 | (uint)local_1c & uVar5,
                    ~uVar4 & (uint)fVar1 | (uint)local_18 & uVar4);
    }
    else {
      iVar3 = __isoc99_sscanf(line,"Collapsed=%d",&local_14);
      if (iVar3 == 1) {
        *(bool *)((long)entry + 0x1c) = local_14 != 0;
      }
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    float x, y; 
    int i;
    if (sscanf(line, "Pos=%f,%f", &x, &y) == 2)         settings->Pos = ImVec2(x, y);
    else if (sscanf(line, "Size=%f,%f", &x, &y) == 2)   settings->Size = ImMax(ImVec2(x, y), GImGui->Style.WindowMinSize);
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     settings->Collapsed = (i != 0);
}